

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

void al_destroy_thread(ALLEGRO_THREAD *thread)

{
  if (thread != (ALLEGRO_THREAD *)0x0) {
    if (thread->thread_state < THREAD_STATE_JOINING) {
      al_join_thread(thread,(void **)0x0);
    }
    thread->thread_state = THREAD_STATE_DESTROYED;
    al_free_with_context
              (thread,0x122,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/threads.c"
               ,"al_destroy_thread");
    return;
  }
  return;
}

Assistant:

void al_destroy_thread(ALLEGRO_THREAD *thread)
{
   if (!thread) {
      return;
   }

   /* Join if required. */
   switch (thread->thread_state) {
      case THREAD_STATE_CREATED: /* fall through */
      case THREAD_STATE_STARTING: /* fall through */
      case THREAD_STATE_STARTED:
         al_join_thread(thread, NULL);
         break;
      case THREAD_STATE_JOINING:
         ASSERT(thread->thread_state != THREAD_STATE_JOINING);
         break;
      case THREAD_STATE_JOINED:
         break;
      case THREAD_STATE_DESTROYED:
         ASSERT(thread->thread_state != THREAD_STATE_DESTROYED);
         break;
      case THREAD_STATE_DETACHED:
         ASSERT(thread->thread_state != THREAD_STATE_DETACHED);
         break;
   }

   /* May help debugging. */
   thread->thread_state = THREAD_STATE_DESTROYED;
   al_free(thread);
}